

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BplusTree.hpp
# Opt level: O2

bool __thiscall
sjtu::BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::erase
          (BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_> *this,
          unsigned_long_long *key)

{
  unsigned_long_long uVar1;
  DynamicFileManager<sjtu::BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::node>
  *pDVar2;
  _func_int *p_Var3;
  long lVar4;
  int iVar5;
  locType *plVar6;
  locType *p;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  node *pnVar8;
  uint uVar9;
  BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_> *pBVar10;
  long lVar11;
  long lVar12;
  BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_> *pBVar13;
  unsigned_long_long *puVar14;
  uint uVar15;
  ulong uVar16;
  int *piVar17;
  ulong uVar18;
  long lVar19;
  ulong uVar20;
  node *pnVar21;
  long lVar22;
  long lVar23;
  undefined8 uStack_70;
  unsigned_long_long uStack_68;
  int local_5c;
  undefined1 *local_58;
  locType *local_50;
  int *local_48;
  locType *local_40;
  BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_> *local_38;
  node *pnVar7;
  
  puVar14 = &uStack_68;
  iVar5 = this->depth;
  lVar22 = (long)iVar5;
  pBVar13 = (BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_> *)0x0;
  if (lVar22 != 0) {
    uVar16 = lVar22 * 8 + 8;
    if (iVar5 < -1) {
      uVar16 = 0xffffffffffffffff;
    }
    local_40 = (locType *)(lVar22 * 4 + 4);
    if (iVar5 < -1) {
      local_40 = (locType *)0xffffffffffffffff;
    }
    uStack_70 = 0x108a05;
    local_38 = this;
    plVar6 = (locType *)operator_new__(uVar16);
    *plVar6 = 0;
    uStack_70 = 0x108a14;
    p = (locType *)operator_new__(uVar16);
    uStack_70 = 0x108a20;
    local_48 = (int *)operator_new__((ulong)local_40);
    local_50 = &local_38->root;
    *plVar6 = local_38->root;
    lVar12 = 0;
    local_40 = plVar6;
    while( true ) {
      piVar17 = local_48;
      lVar23 = (long)(int)lVar22;
      if (lVar23 <= lVar12) break;
      plVar6 = local_40 + lVar12;
      uStack_70 = 0x108a67;
      iVar5 = (*(local_38->file->
                super_FileManager_Base<sjtu::BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::node>
                )._vptr_FileManager_Base[2])(local_38->file,plVar6);
      pnVar7 = (node *)CONCAT44(extraout_var,iVar5);
      p[lVar12] = (locType)pnVar7;
      this = (BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_> *)
             (ulong)(uint)pnVar7->sz;
      if (pnVar7->sz < 1) {
        this = pBVar13;
      }
      for (pBVar10 = (BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_> *)0x0
          ; this != pBVar10;
          pBVar10 = (BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_> *)
                    ((long)&pBVar10->depth + 1)) {
        if (*key <= pnVar7->keyvalue[(long)pBVar10]) {
          lVar22 = (long)local_38->depth;
          if (lVar22 + -1 <= lVar12) {
            this = (BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_> *)
                   ((ulong)pBVar10 & 0xffffffff);
            goto LAB_00108ad9;
          }
          this = (BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_> *)
                 (ulong)(((int)pBVar10 + 1) - (uint)(*key < pnVar7->keyvalue[(long)pBVar10]));
          goto LAB_00108aca;
        }
      }
      lVar22 = (long)local_38->depth;
      if (lVar12 < lVar22 + -1) {
LAB_00108aca:
        plVar6[1] = (pnVar7->field_0).val[(int)this];
      }
LAB_00108ad9:
      local_48[lVar12] = (int)this;
      lVar12 = lVar12 + 1;
    }
    pnVar7 = (node *)p[lVar23 + -1];
    iVar5 = (int)this;
    if ((iVar5 == pnVar7->sz) || (*key < pnVar7->keyvalue[iVar5])) {
      uStack_70 = 0x108b0d;
      operator_delete__(p);
      uStack_70 = 0x108b15;
      operator_delete__(piVar17);
      uStack_70 = 0x108b1e;
      operator_delete__(local_40);
      pBVar13 = (BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_> *)0x0;
    }
    else {
      if (iVar5 == 0) {
        for (uVar9 = (int)lVar22 - 2; -1 < (int)uVar9; uVar9 = uVar9 - 1) {
          lVar22 = (long)local_48[uVar9];
          if ((lVar22 != 0) && (((node *)p[uVar9])->keyvalue[lVar22 + -1] == pnVar7->keyvalue[0])) {
            ((node *)p[uVar9])->keyvalue[lVar22 + -1] = pnVar7->keyvalue[1];
            uStack_70 = 0x108cb9;
            (*(local_38->file->
              super_FileManager_Base<sjtu::BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::node>
              )._vptr_FileManager_Base[3])(local_38->file,local_40 + uVar9);
            break;
          }
        }
      }
      pBVar13 = local_38;
      plVar6 = local_40;
      piVar17 = local_48;
      lVar22 = (long)iVar5 + 0x66;
      while( true ) {
        pnVar7 = (node *)p[lVar23 + -1];
        iVar5 = pnVar7->sz;
        if ((long)iVar5 <= lVar22 + -0x65) break;
        *(long *)((long)pnVar7 + lVar22 * 8 + -8) = (pnVar7->field_0).val[lVar22];
        *(undefined8 *)((long)pnVar7 + lVar22 * 8 + -0x330) =
             *(undefined8 *)((long)pnVar7 + lVar22 * 8 + -0x328);
        lVar22 = lVar22 + 1;
      }
      pnVar7->sz = iVar5 + -1;
      lVar22 = (long)local_38->depth;
      if (lVar22 == 1) {
        if (iVar5 + -1 == 0) {
          local_38->depth = 0;
          uStack_70 = 0x108c7f;
          DynamicFileManager<sjtu::BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::node>
          ::release(local_38->file,local_38->root);
          pBVar13->root = -1;
        }
        else {
          uStack_70 = 0x108b97;
          (*(local_38->file->
            super_FileManager_Base<sjtu::BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::node>
            )._vptr_FileManager_Base[3])(local_38->file,local_50);
        }
        uStack_70 = 0x108c8c;
        operator_delete__(p);
        puVar14 = &uStack_68;
        piVar17 = local_48;
      }
      else {
        if (iVar5 < 0x33) {
          iVar5 = local_48[lVar22 + -2];
          pnVar7 = (node *)p[lVar22 + -2];
          if (iVar5 == pnVar7->sz) {
            p[lVar22] = (locType)p[lVar22 + -1];
            local_48[lVar22] = iVar5;
            local_40[lVar22] = local_40[lVar22 + -1];
            iVar5 = pnVar7->sz;
            local_48[lVar22 + -2] = iVar5 + -1;
            local_40[lVar22 + -1] = *(locType *)((long)pnVar7 + (long)iVar5 * 8 + -8);
            uStack_70 = 0x108c53;
            iVar5 = (*(local_38->file->
                      super_FileManager_Base<sjtu::BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::node>
                      )._vptr_FileManager_Base[2])(local_38->file,local_40 + lVar22 + -1);
            lVar22 = (long)local_38->depth;
            p[lVar22 + -1] = (locType)CONCAT44(extraout_var_00,iVar5);
            pnVar7 = (node *)p[lVar22];
          }
          else {
            local_48[lVar22] = iVar5 + 1;
            local_40[lVar22] = *(locType *)((long)&pnVar7->field_0 + (long)iVar5 * 8 + 8);
            uStack_70 = 0x108cee;
            iVar5 = (*(local_38->file->
                      super_FileManager_Base<sjtu::BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::node>
                      )._vptr_FileManager_Base[2])(local_38->file,local_40 + lVar22);
            pnVar7 = (node *)CONCAT44(extraout_var_01,iVar5);
            lVar22 = (long)local_38->depth;
            p[lVar22] = (locType)pnVar7;
          }
          pBVar13 = local_38;
          pnVar8 = (node *)p[lVar23 + -1];
          uVar16 = (ulong)(uint)pnVar8->sz;
          iVar5 = pnVar7->sz;
          uVar9 = iVar5 + pnVar8->sz;
          if ((int)uVar9 < 100) {
            for (lVar12 = 0; lVar12 < iVar5; lVar12 = lVar12 + 1) {
              (pnVar8->field_0).val[(int)uVar16 + (int)lVar12] = (pnVar7->field_0).val[lVar12];
              pnVar7 = (node *)p[lVar22];
              pnVar8 = (node *)p[lVar23 + -1];
              uVar16 = (ulong)pnVar8->sz;
              pnVar8->keyvalue[uVar16 + lVar12] = pnVar7->keyvalue[lVar12];
              iVar5 = pnVar7->sz;
            }
            pnVar8->nxt = pnVar7->nxt;
            pnVar8->sz = (int)uVar16 + iVar5;
            uStack_70 = 0x108e0b;
            (*(local_38->file->
              super_FileManager_Base<sjtu::BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::node>
              )._vptr_FileManager_Base[3])(local_38->file,plVar6 + (long)local_38->depth + -1);
            uStack_70 = 0x108e1b;
            DynamicFileManager<sjtu::BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::node>
            ::release(pBVar13->file,plVar6[pBVar13->depth]);
            piVar17 = local_48;
            local_5c = pBVar13->depth + -2;
            uStack_70 = 0x108e3b;
            erasenonleaf(pBVar13,&local_5c,(node **)p,local_48,plVar6);
          }
          else {
            local_58 = (undefined1 *)&uStack_68;
            uVar18 = (ulong)uVar9;
            lVar12 = -0x68 - (uVar18 * 8 + 0x17 & 0xfffffffffffffff0);
            lVar4 = lVar12 - (uVar18 * 8 + 0xf & 0xfffffffffffffff0);
            pnVar7 = (node *)p[lVar22];
            uVar1 = pnVar7->keyvalue[0];
            local_50 = p;
            pnVar8 = (node *)p[lVar23 + -1];
            uVar15 = pnVar8->sz;
            lVar19 = (long)(int)uVar15;
            uVar20 = 0;
            uVar16 = 0;
            if (0 < (int)uVar15) {
              uVar16 = (ulong)uVar15;
            }
            for (; plVar6 = local_40, pnVar21 = pnVar7, uVar16 != uVar20; uVar20 = uVar20 + 1) {
              *(long *)((long)&uStack_68 + uVar20 * 8 + lVar12 + 0x68) =
                   (pnVar8->field_0).val[uVar20];
              *(unsigned_long_long *)((long)&uStack_68 + uVar20 * 8 + lVar4 + 0x68) =
                   pnVar8->keyvalue[uVar20];
            }
            for (; lVar19 < (long)uVar18; lVar19 = lVar19 + 1) {
              *(long *)((long)&uStack_68 + lVar19 * 8 + lVar12 + 0x68) = (pnVar21->field_0).val[0];
              *(unsigned_long_long *)((long)&uStack_68 + lVar19 * 8 + lVar4 + 0x68) =
                   pnVar21->keyvalue[0];
              pnVar21 = (node *)((pnVar21->field_0).val + 1);
            }
            uVar15 = uVar9 + 1 >> 1;
            pnVar8->sz = uVar15;
            pnVar7->sz = uVar9 - uVar15;
            for (lVar19 = 0; lVar11 = (long)pnVar8->sz, lVar19 < lVar11; lVar19 = lVar19 + 1) {
              (pnVar8->field_0).val[lVar19] =
                   *(long *)((long)&uStack_68 + lVar19 * 8 + lVar12 + 0x68);
              pnVar8 = (node *)local_50[lVar23 + -1];
              pnVar8->keyvalue[lVar19] =
                   *(unsigned_long_long *)((long)&uStack_68 + lVar19 * 8 + lVar4 + 0x68);
            }
            pnVar7 = (node *)local_50[lVar22];
            for (lVar19 = 0; lVar19 < pnVar7->sz; lVar19 = lVar19 + 1) {
              (pnVar7->field_0).val[lVar19] =
                   *(long *)((long)&uStack_68 +
                            (long)((int)lVar11 + (int)lVar19) * 8 + lVar12 + 0x68);
              lVar11 = (long)((node *)local_50[lVar23 + -1])->sz;
              pnVar7 = (node *)local_50[lVar22];
              pnVar7->keyvalue[lVar19] =
                   *(unsigned_long_long *)((long)&uStack_68 + (lVar11 + lVar19) * 8 + lVar4 + 0x68);
            }
            pDVar2 = local_38->file;
            iVar5 = local_38->depth;
            p_Var3 = (pDVar2->
                     super_FileManager_Base<sjtu::BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::node>
                     )._vptr_FileManager_Base[3];
            *(undefined8 *)((long)&uStack_70 + lVar4 + 0x68) = 0x108f0a;
            (*p_Var3)(pDVar2,plVar6 + (long)iVar5 + -1);
            pDVar2 = local_38->file;
            iVar5 = local_38->depth;
            p_Var3 = (pDVar2->
                     super_FileManager_Base<sjtu::BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::node>
                     )._vptr_FileManager_Base[3];
            *(undefined8 *)((long)&uStack_70 + lVar4 + 0x68) = 0x108f23;
            (*p_Var3)(pDVar2,plVar6 + iVar5);
            uVar9 = local_38->depth - 2;
            do {
              uVar15 = uVar9;
              pBVar13 = local_38;
              puVar14 = (unsigned_long_long *)local_58;
              p = local_50;
              piVar17 = local_48;
              if ((int)uVar15 < 0) goto LAB_00108f82;
              uVar9 = uVar15 - 1;
            } while (((node *)local_50[uVar15])->keyvalue[local_48[uVar15]] != uVar1);
            ((node *)local_50[uVar15])->keyvalue[local_48[uVar15]] =
                 ((node *)local_50[lVar22])->keyvalue[0];
            pDVar2 = local_38->file;
            p_Var3 = (pDVar2->
                     super_FileManager_Base<sjtu::BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::node>
                     )._vptr_FileManager_Base[3];
            *(undefined8 *)((long)&uStack_70 + lVar4 + 0x68) = 0x108f6f;
            (*p_Var3)(pDVar2,plVar6 + uVar15);
            pBVar13 = local_38;
            puVar14 = (unsigned_long_long *)local_58;
            p = local_50;
            piVar17 = local_48;
          }
        }
        else {
          uStack_70 = 0x108bbc;
          (*(local_38->file->
            super_FileManager_Base<sjtu::BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::node>
            )._vptr_FileManager_Base[3])(local_38->file,local_40 + lVar22 + -1);
          puVar14 = &uStack_68;
        }
LAB_00108f82:
        *(undefined8 *)((long)puVar14 + -8) = 0x108f87;
        operator_delete__(p);
      }
      *(undefined8 *)((long)puVar14 + -8) = 0x108f8f;
      operator_delete__(piVar17);
      *(undefined8 *)((long)puVar14 + -8) = 0x108f97;
      operator_delete__(plVar6);
      pBVar13->siz = pBVar13->siz + -1;
      pBVar13 = (BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_> *)0x1;
    }
  }
  return SUB81(pBVar13,0);
}

Assistant:

bool erase(const Key &key) {
            if (!depth)return 0;
            int i, j;
            locType *pos;
            node **p;
            int *pp;
            pos = new locType[depth + 1];
            memset(pos, 0, sizeof pos);
            p = new node *[depth + 1];
            pp = new int[depth + 1];
            pos[0] = root;
            for (i = 0; i < depth; ++i) {
                p[i] = file->read(pos[i]);
                for (j = 0; j < p[i]->sz && Compare()(p[i]->keyvalue[j], key); ++j);
                if (i < depth - 1) {
                    if (j < p[i]->sz && !Compare()(key, p[i]->keyvalue[j]))++j;
                    pos[i + 1] = p[i]->pointer[j];
                }
                pp[i] = j;
            }
            if (j == p[depth - 1]->sz || Compare()(key, p[depth - 1]->keyvalue[j])) {
                delete[]p;
                delete[]pp;
                delete[]pos;
                return 0;
            }
            node *&x = p[depth - 1];
            if (!j) {
                for (i = depth - 2; i >= 0; --i)
                    if (pp[i] && equal(x->keyvalue[0], p[i]->keyvalue[pp[i] - 1])) {
                        p[i]->keyvalue[pp[i] - 1] = x->keyvalue[1];
                        file->save(pos[i]);
                        break;
                    }
            }
            //file->release(x->pointer[j]);
            for (i = j + 1; i < x->sz; ++i)x->keyvalue[i - 1] = x->keyvalue[i], x->val[i - 1] = x->val[i];
            --x->sz;
            if (depth == 1) {
                if (!x->sz) {
                    depth = 0;
                    file->release(root);
                    root = -1;
                } else {
                    file->save(root);
                }
                delete[]p;
                delete[]pp;
                delete[]pos;
                --siz;
                return 1;
            }
            if (x->sz >= degree >> 1) {
                file->save(pos[depth - 1]);
                delete[]p;
                delete[]pp;
                delete[]pos;
                --siz;
                return 1;
            }
            if (pp[depth - 2] == p[depth - 2]->sz) {
                p[depth] = p[depth - 1];
                pp[depth] = pp[depth - 2];
                pos[depth] = pos[depth - 1];
                pp[depth - 2] = p[depth - 2]->sz - 1;
                pos[depth - 1] = p[depth - 2]->pointer[pp[depth - 2]];
                p[depth - 1] = file->read(pos[depth - 1]);
            } else {
                pp[depth] = pp[depth - 2] + 1;
                pos[depth] = p[depth - 2]->pointer[pp[depth]];
                p[depth] = file->read(pos[depth]);
            }
            node *&y = p[depth];
            if (x->sz + y->sz < degree) {
                for (i = 0; i < y->sz; ++i)x->val[x->sz + i] = y->val[i], x->keyvalue[x->sz + i] = y->keyvalue[i];
                x->nxt = y->nxt;
                x->sz += y->sz;
                file->save(pos[depth - 1]);
                file->release(pos[depth]);
                erasenonleaf(depth - 2, p, pp, pos);
            } else {
                int newsz = x->sz + y->sz;
                T tmpv[newsz + 1];
                Key tmpk[newsz], old = y->keyvalue[0];
                for (i = 0; i < x->sz; ++i)tmpv[i] = x->val[i], tmpk[i] = x->keyvalue[i];
                for (i = x->sz; i < newsz; ++i)tmpv[i] = y->val[i - x->sz], tmpk[i] = y->keyvalue[i - x->sz];
                x->sz = newsz + 1 >> 1;
                y->sz = newsz - x->sz;
                for (i = 0; i < x->sz; ++i)x->val[i] = tmpv[i], x->keyvalue[i] = tmpk[i];
                for (i = 0; i < y->sz; ++i)y->val[i] = tmpv[i + x->sz], y->keyvalue[i] = tmpk[i + x->sz];
                file->save(pos[depth - 1]);
                file->save(pos[depth]);
                for (i = depth - 2; i >= 0; --i)
                    if (equal(old, p[i]->keyvalue[pp[i]])) {
                        p[i]->keyvalue[pp[i]] = y->keyvalue[0];
                        file->save(pos[i]);
                        break;
                    }
            }
            delete[]p;
            delete[]pp;
            delete[]pos;
            --siz;
            return 1;
        }